

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::LoopConstraintSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,LoopConstraintSyntax *this,size_t index)

{
  Info *pIVar1;
  __index_type _Var2;
  ForeachLoopListSyntax *pFVar3;
  
  if (index == 2) {
    pFVar3 = (ForeachLoopListSyntax *)(this->constraints).ptr;
  }
  else {
    if (index != 1) {
      if (index == 0) {
        pIVar1 = (this->foreachKeyword).info;
        *(undefined8 *)
         &(__return_storage_ptr__->
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
             *(undefined8 *)&this->foreachKeyword;
        *(Info **)((long)&(__return_storage_ptr__->
                          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
                          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  + 8) = pIVar1;
      }
      else {
        parsing::Token::Token((Token *)__return_storage_ptr__);
      }
      _Var2 = '\0';
      goto LAB_0027b557;
    }
    pFVar3 = (this->loopList).ptr;
  }
  *(ForeachLoopListSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pFVar3;
  _Var2 = '\x01';
LAB_0027b557:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax LoopConstraintSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return foreachKeyword;
        case 1: return loopList.get();
        case 2: return constraints.get();
        default: return nullptr;
    }
}